

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O2

void __thiscall DivideTest<unsigned_long>::run(DivideTest<unsigned_long> *this)

{
  int iVar1;
  int i;
  ulong uVar2;
  UT denom;
  unsigned_long uVar3;
  long lVar4;
  bool bVar5;
  set_t<unsigned_long> tested_denom;
  
  tested_denom._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &tested_denom._M_t._M_impl.super__Rb_tree_header._M_header;
  tested_denom._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  tested_denom._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  tested_denom._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  tested_denom._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       tested_denom._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (uVar3 = 1; uVar3 != 0x400; uVar3 = uVar3 + 1) {
    test_all_algorithms(this,uVar3,&tested_denom);
  }
  test_all_algorithms(this,0xffffffffffffffff,&tested_denom);
  for (uVar2 = 1; uVar2 != 0x40; uVar2 = uVar2 + 1) {
    for (lVar4 = -1; lVar4 != 2; lVar4 = lVar4 + 1) {
      test_all_algorithms(this,(1L << (uVar2 & 0x3f)) + lVar4,&tested_denom);
    }
  }
  for (uVar3 = 0xffffffffffffffff; uVar3 != 0; uVar3 = uVar3 * 2) {
    test_all_algorithms(this,uVar3,&tested_denom);
  }
  iVar1 = 10000;
  while (bVar5 = iVar1 != 0, iVar1 = iVar1 + -1, bVar5) {
    uVar3 = random_denominator(this);
    test_all_algorithms(this,uVar3,&tested_denom);
  }
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree(&tested_denom._M_t);
  return;
}

Assistant:

void run() {
        set_t<T> tested_denom;

        // Test small values
#if defined(__AVR__)
        UT primes[] = {2, 3, 5, 7, 11, 13, 17, 19, 23, 29, 31, 37, 41, 43, 47, 53, 59, 61, 67, 71,
            73, 79, 83, 89, 97, 101, 103, 107, 109, 113, 127, 131, 137, 139, 149, 151, 157, 163,
            167, 173};
        for (size_t index = 0; index < sizeof(primes) / sizeof(primes[0]); ++index) {
            test_both_signs(primes[index], tested_denom);
        }
#else
        for (UT denom = 1; denom < 1024; ++denom) {
            test_both_signs(denom, tested_denom);
        }
#endif

        if (limits::is_signed) {
            PRINT_PROGRESS_MSG(F("Testing minimum\n"));
            test_all_algorithms((limits::min)(), tested_denom);
        }

        PRINT_PROGRESS_MSG(F("Testing maximum\n"));
        test_all_algorithms((limits::max)(), tested_denom);

        // test power of 2 denoms: 2^i-1, 2^i, 2^i+1
        PRINT_PROGRESS_MSG(F("Testing powers of 2\n"));
        for (int i = 1; i < limits::digits; i++) {
            for (int j = -1; j <= 1; j++) {
                T denom = static_cast<UT>((static_cast<T>(1) << i) + j);

                test_both_signs(denom, tested_denom);
            }
        }

        // test all bits set:
        // 11111111, 11111110, 11111100, ...
        PRINT_PROGRESS_MSG(F("Testing all bits set\n"));
        // For signed types, this degenerates to negative powers of
        // 2 (-1, -2, -4....): since we just tested those (above), skip.
        if (!limits::is_signed) {
            for (UT bits = (std::numeric_limits<UT>::max)(); bits != 0; bits <<= 1) {
                PRINT_PROGRESS_MSG((T)bits);
                PRINT_PROGRESS_MSG("\n");
                test_all_algorithms((T)bits, tested_denom);
            }
        }

        // Test random denominators
#if !defined(__AVR__)
        PRINT_PROGRESS_MSG(F("Test random denominators\n"));
        for (int i = 0; i < 10000; ++i) {
            test_all_algorithms(random_denominator(), tested_denom);
        }
#endif
    }